

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_scalar_umul128_unroll2(uint16_t *in,uint32_t n,uint32_t *out)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  uint local_50;
  
  if (7 < n) {
    auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])out);
    auVar13._8_4_ = 0xfff;
    auVar13._0_8_ = 0xfff00000fff;
    auVar13._12_4_ = 0xfff;
    auVar15._16_4_ = 0xfff;
    auVar15._0_16_ = auVar13;
    auVar15._20_4_ = 0xfff;
    auVar15._24_4_ = 0xfff;
    auVar15._28_4_ = 0xfff;
    do {
      uVar7 = 0xfff;
      if (n < 0xfff) {
        uVar7 = n;
      }
      uVar7 = uVar7 & 0xff8;
      if (uVar7 == 0) {
        lVar11 = 0;
        lVar12 = 0;
        lVar10 = 0;
        lVar8 = 0;
      }
      else {
        puVar1 = (ulong *)((long)in + (ulong)uVar7 * 2);
        lVar8 = 0;
        lVar10 = 0;
        lVar12 = 0;
        lVar11 = 0;
        do {
          uVar9 = *(ulong *)in;
          uVar2 = *(ulong *)((long)in + 8);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = (uVar2 & 0x1111111111111111) + (uVar9 & 0x1111111111111111);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = (uVar2 & 0x2222222222222222) + (uVar9 & 0x2222222222222222) >> 1;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = (uVar2 & 0x4444444444444444) + (uVar9 & 0x4444444444444444) >> 2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (uVar2 >> 3 & 0x1111111111111111) + (uVar9 >> 3 & 0x1111111111111111);
          lVar8 = lVar8 + (SUB168(auVar23 * ZEXT816(0x1000100010001),8) +
                           SUB168(auVar23 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
          lVar10 = lVar10 + (SUB168(auVar26 * ZEXT816(0x1000100010001),8) +
                             SUB168(auVar26 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
          lVar12 = lVar12 + (SUB168(auVar27 * ZEXT816(0x1000100010001),8) +
                             SUB168(auVar27 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
          lVar11 = lVar11 + (SUB168(auVar5 * ZEXT816(0x1000100010001),8) +
                             SUB168(auVar5 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
          in = (uint16_t *)((long)in + 0x10);
        } while ((ulong *)in != puVar1);
      }
      n = n - uVar7;
      auVar23 = vpinsrd_avx(ZEXT416((uint)((ulong)lVar8 >> 0x18)),(int)((ulong)lVar10 >> 0x18),1);
      auVar23 = vpinsrd_avx(auVar23,(int)((ulong)lVar12 >> 0x18),2);
      auVar23 = vpinsrd_avx(auVar23,(int)((ulong)lVar11 >> 0x18),3);
      auVar26 = vpinsrd_avx(ZEXT416((uint)lVar8),(int)lVar10,1);
      auVar26 = vpinsrd_avx(auVar26,(int)lVar12,2);
      auVar26 = vpinsrd_avx(auVar26,(int)lVar11,3);
      auVar27 = vpsrld_avx(auVar26,0xc);
      auVar24._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar23;
      auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
      auVar24 = vpand_avx2(auVar24,auVar15);
      local_50 = (uint)((ulong)lVar10 >> 0x24);
      auVar23 = vpinsrd_avx(ZEXT416((uint)((ulong)lVar8 >> 0x24)),local_50,1);
      auVar23 = vpinsrd_avx(auVar23,(uint)((ulong)lVar12 >> 0x24),2);
      auVar27 = vpinsrd_avx(auVar23,(uint)((ulong)lVar11 >> 0x24),3);
      auVar23 = vpand_avx(auVar26,auVar13);
      auVar17 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar27,
                                               ZEXT116(0) * auVar27 + ZEXT116(1) * auVar23)),auVar24
                           ,1);
      auVar16 = vpaddd_avx512f(auVar16,auVar17);
      auVar17 = vmovdqu64_avx512f(auVar16);
      *(undefined1 (*) [64])out = auVar17;
    } while (7 < n);
  }
  if (n != 0) {
    auVar16 = vpbroadcastq_avx512f();
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    uVar9 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar21 = vmovdqa64_avx512f(auVar30);
      auVar22 = vmovdqa64_avx512f(auVar29);
      auVar29 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar29,auVar17);
      uVar2 = vpcmpuq_avx512f(auVar29,auVar16,2);
      auVar13 = vmovdqu16_avx512vl(*(undefined1 (*) [16])((long)in + uVar9 * 2));
      bVar3 = (byte)uVar2;
      auVar14._2_2_ = (ushort)((byte)(uVar2 >> 1) & 1) * auVar13._2_2_;
      auVar14._0_2_ = (ushort)(bVar3 & 1) * auVar13._0_2_;
      auVar14._4_2_ = (ushort)((byte)(uVar2 >> 2) & 1) * auVar13._4_2_;
      auVar14._6_2_ = (ushort)((byte)(uVar2 >> 3) & 1) * auVar13._6_2_;
      auVar14._8_2_ = (ushort)((byte)(uVar2 >> 4) & 1) * auVar13._8_2_;
      auVar14._10_2_ = (ushort)((byte)(uVar2 >> 5) & 1) * auVar13._10_2_;
      auVar14._12_2_ = (ushort)((byte)(uVar2 >> 6) & 1) * auVar13._12_2_;
      auVar14._14_2_ = (ushort)(byte)(uVar2 >> 7) * auVar13._14_2_;
      auVar30 = vpmovzxwq_avx512f(auVar14);
      auVar29 = vpandq_avx512f(auVar30,auVar18);
      auVar29 = vpmullq_avx512dq(auVar29,auVar19);
      auVar29 = vpandq_avx512f(auVar29,auVar20);
      auVar29 = vpaddq_avx512f(auVar29,auVar22);
      auVar30 = vpsrlq_avx512f(auVar30,1);
      auVar30 = vpandq_avx512f(auVar30,auVar18);
      auVar30 = vpmullq_avx512dq(auVar30,auVar19);
      auVar30 = vpandq_avx512f(auVar30,auVar20);
      auVar30 = vpaddq_avx512f(auVar30,auVar21);
      uVar9 = uVar9 + 8;
    } while ((n + 7 & 8) != uVar9);
    auVar16 = vmovdqa64_avx512f(auVar30);
    auVar17._0_8_ = (ulong)(bVar3 & 1) * auVar16._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar21._0_8_;
    bVar4 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar17._8_8_ = (ulong)bVar4 * auVar16._8_8_ | (ulong)!bVar4 * auVar21._8_8_;
    bVar4 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar17._16_8_ = (ulong)bVar4 * auVar16._16_8_ | (ulong)!bVar4 * auVar21._16_8_;
    bVar4 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar17._24_8_ = (ulong)bVar4 * auVar16._24_8_ | (ulong)!bVar4 * auVar21._24_8_;
    bVar4 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar17._32_8_ = (ulong)bVar4 * auVar16._32_8_ | (ulong)!bVar4 * auVar21._32_8_;
    bVar4 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar17._40_8_ = (ulong)bVar4 * auVar16._40_8_ | (ulong)!bVar4 * auVar21._40_8_;
    bVar4 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar17._48_8_ = (ulong)bVar4 * auVar16._48_8_ | (ulong)!bVar4 * auVar21._48_8_;
    auVar17._56_8_ = (uVar2 >> 7) * auVar16._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * auVar21._56_8_;
    auVar16 = vmovdqa64_avx512f(auVar29);
    auVar18._0_8_ = (ulong)(bVar3 & 1) * auVar16._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar22._0_8_;
    bVar4 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar18._8_8_ = (ulong)bVar4 * auVar16._8_8_ | (ulong)!bVar4 * auVar22._8_8_;
    bVar4 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar18._16_8_ = (ulong)bVar4 * auVar16._16_8_ | (ulong)!bVar4 * auVar22._16_8_;
    bVar4 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar18._24_8_ = (ulong)bVar4 * auVar16._24_8_ | (ulong)!bVar4 * auVar22._24_8_;
    bVar4 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar18._32_8_ = (ulong)bVar4 * auVar16._32_8_ | (ulong)!bVar4 * auVar22._32_8_;
    bVar4 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar18._40_8_ = (ulong)bVar4 * auVar16._40_8_ | (ulong)!bVar4 * auVar22._40_8_;
    bVar4 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar18._48_8_ = (ulong)bVar4 * auVar16._48_8_ | (ulong)!bVar4 * auVar22._48_8_;
    auVar18._56_8_ = (uVar2 >> 7) * auVar16._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * auVar22._56_8_;
    auVar15 = vextracti64x4_avx512f(auVar18,1);
    auVar16 = vpaddq_avx512f(auVar18,ZEXT3264(auVar15));
    auVar13 = vpaddq_avx(auVar16._0_16_,auVar16._16_16_);
    auVar23 = vpshufd_avx(auVar13,0xee);
    auVar13 = vpaddq_avx(auVar13,auVar23);
    auVar15 = vextracti64x4_avx512f(auVar17,1);
    auVar16 = vpaddq_avx512f(auVar17,ZEXT3264(auVar15));
    auVar23 = vpaddq_avx(auVar16._0_16_,auVar16._16_16_);
    auVar26 = vpshufd_avx(auVar23,0xee);
    auVar23 = vpaddq_avx(auVar23,auVar26);
    auVar27 = vpunpckldq_avx(auVar13,auVar23);
    auVar26 = vpsrld_avx(auVar27,8);
    auVar26 = vpinsrd_avx(auVar26,auVar13._0_4_,2);
    auVar26 = vpinsrd_avx(auVar26,auVar23._0_4_,3);
    auVar26 = vpshufb_avx(auVar26,_DAT_0010f020);
    auVar5 = vpunpcklqdq_avx(auVar13,auVar23);
    auVar13 = vpshufb_avx(auVar5,_DAT_0010f030);
    auVar28._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar5;
    auVar28._16_16_ = ZEXT116(1) * auVar5;
    auVar15 = vpsrlvq_avx2(auVar28,_DAT_00110540);
    auVar14 = vpmovqd_avx512vl(auVar15);
    auVar23 = vpshufb_avx(auVar27,_DAT_0010f040);
    auVar25._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar23;
    auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    auVar6._8_4_ = 0xff;
    auVar6._0_8_ = 0xff000000ff;
    auVar6._12_4_ = 0xff;
    auVar6._16_4_ = 0xff;
    auVar6._20_4_ = 0xff;
    auVar6._24_4_ = 0xff;
    auVar6._28_4_ = 0xff;
    auVar15 = vpandd_avx512vl(auVar25,auVar6);
    auVar23 = vpsrlq_avx(auVar5,0x38);
    auVar16 = vinserti32x4_avx512f(ZEXT3264(auVar15),auVar26,2);
    auVar16 = vinserti32x4_avx512f(auVar16,auVar13,3);
    auVar17 = vpmovsxbd_avx512f(_DAT_0010f050);
    auVar16 = vpermi2d_avx512f(auVar17,auVar16,ZEXT1664(auVar23));
    auVar16 = vpaddd_avx512f(auVar16,*(undefined1 (*) [64])out);
    auVar16 = vmovdqu64_avx512f(auVar16);
    *(undefined1 (*) [64])out = auVar16;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128_unroll2(const uint16_t* in, uint32_t n, uint32_t* out) {
    while (n >= 8) {
        uint64_t counter_a = 0; // 4 packed 12-bit counters
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // end before overflowing the counters
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~7;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 8) {
            const uint64_t mask_a = UINT64_C(0x1111111111111111);
            const uint64_t mask_b = mask_a + mask_a;
            const uint64_t mask_c = mask_b + mask_b;
            const uint64_t mask_0001 = UINT64_C(0x0001000100010001);
            const uint64_t mask_cnts = UINT64_C(0x000000F00F00F00F);

            uint64_t v0 = pospopcnt_loadu_u64(&in[0]);
            uint64_t v1 = pospopcnt_loadu_u64(&in[4]);

            uint64_t a = (v0 & mask_a) + (v1 & mask_a);
            uint64_t b = ((v0 & mask_b) + (v1 & mask_b)) >> 1;
            uint64_t c = ((v0 & mask_c) + (v1 & mask_c)) >> 2;
            uint64_t d = ((v0 >> 3) & mask_a) + ((v1 >> 3) & mask_a);

            uint64_t hi;
            a = pospopcnt_umul128(a, mask_0001, &hi);
            a += hi; // broadcast 4-bit counts
            b = pospopcnt_umul128(b, mask_0001, &hi);
            b += hi;
            c = pospopcnt_umul128(c, mask_0001, &hi);
            c += hi;
            d = pospopcnt_umul128(d, mask_0001, &hi);
            d += hi;

            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d & mask_cnts;
        }

        out[0] += counter_a & 0x0FFF;
        out[1] += counter_b & 0x0FFF;
        out[2] += counter_c & 0x0FFF;
        out[3] += counter_d & 0x0FFF;
        out[4] += (counter_a >> 36);
        out[5] += (counter_b >> 36);
        out[6] += (counter_c >> 36);
        out[7] += (counter_d >> 36);
        out[8] += (counter_a >> 24) & 0x0FFF;
        out[9] += (counter_b >> 24) & 0x0FFF;
        out[10] += (counter_c >> 24) & 0x0FFF;
        out[11] += (counter_d >> 24) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d >> 12) & 0x0FFF;
    }

    // assert(n < 8)
    if (n != 0) {
        uint64_t tail_counter_a = 0;
        uint64_t tail_counter_b = 0;
        do { // zero-extend a bit to 8-bits (emulate pdep) then accumulate
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);
            const uint64_t magic   = UINT64_C(0x0000040010004001); // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *in++;
            tail_counter_a += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            tail_counter_b += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--n);

        out[0]  += tail_counter_a & 0xFF;
        out[8]  += (tail_counter_a >>  8) & 0xFF;
        out[2]  += (tail_counter_a >> 16) & 0xFF;
        out[10] += (tail_counter_a >> 24) & 0xFF;
        out[4]  += (tail_counter_a >> 32) & 0xFF;
        out[12] += (tail_counter_a >> 40) & 0xFF;
        out[6]  += (tail_counter_a >> 48) & 0xFF;
        out[14] += (tail_counter_a >> 56) & 0xFF;
        out[1]  += tail_counter_b & 0xFF;
        out[9]  += (tail_counter_b >>  8) & 0xFF;
        out[3]  += (tail_counter_b >> 16) & 0xFF;
        out[11] += (tail_counter_b >> 24) & 0xFF;
        out[5]  += (tail_counter_b >> 32) & 0xFF;
        out[13] += (tail_counter_b >> 40) & 0xFF;
        out[7]  += (tail_counter_b >> 48) & 0xFF;
        out[15] += (tail_counter_b >> 56) & 0xFF;
    }

    return 0;
}